

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O2

Ref<anurbs::Brep> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Brep>::add
          (PythonDataType<anurbs::Model,_anurbs::Brep> *this,Model *self,Pointer<anurbs::Brep> *data
          )

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Brep> RVar1;
  __shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&data->super___shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>);
  Model::add<anurbs::Brep>((Model *)this,(Pointer<anurbs::Brep> *)self);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref<anurbs::Brep>)
         RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> add(TModel& self, Pointer<TData> data)
    {
        return self.template add<TData>(data);
    }